

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O1

ScenarioUpperBound * __thiscall
despot::BaseTag::CreateScenarioUpperBound(BaseTag *this,string *name,string *particle_bound_name)

{
  pointer pcVar1;
  int iVar2;
  LookaheadUpperBound *this_00;
  ParticleUpperBound *pPVar3;
  ostream *poVar4;
  long *plVar5;
  long *plVar6;
  long *local_60 [2];
  long local_50 [2];
  long *local_40 [2];
  long local_30 [2];
  
  iVar2 = std::__cxx11::string::compare((char *)name);
  if (iVar2 != 0) {
    iVar2 = std::__cxx11::string::compare((char *)name);
    if (iVar2 != 0) {
      iVar2 = std::__cxx11::string::compare((char *)name);
      if (iVar2 != 0) {
        iVar2 = std::__cxx11::string::compare((char *)name);
        if (iVar2 != 0) {
          iVar2 = std::__cxx11::string::compare((char *)name);
          if (iVar2 != 0) {
            iVar2 = std::__cxx11::string::compare((char *)name);
            if (iVar2 != 0) {
              iVar2 = std::__cxx11::string::compare((char *)name);
              if (iVar2 != 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Unsupported upper bound: ",0x19);
                poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&std::cerr,(name->_M_dataplus)._M_p,
                                    name->_M_string_length);
                std::endl<char,std::char_traits<char>>(poVar4);
              }
              poVar4 = std::operator<<((ostream *)&std::cerr,
                                       "Supported types: TRIVIAL, MDP, SP, MANHATTAN, LOOKAHEAD (default to SP)"
                                      );
              std::endl<char,std::char_traits<char>>(poVar4);
              poVar4 = std::operator<<((ostream *)&std::cerr,"With base upper bound: LOOKAHEAD");
              std::endl<char,std::char_traits<char>>(poVar4);
              exit(1);
            }
            this_00 = (LookaheadUpperBound *)operator_new(0x38);
            plVar6 = local_50;
            pcVar1 = (particle_bound_name->_M_dataplus)._M_p;
            local_60[0] = plVar6;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_60,pcVar1,pcVar1 + particle_bound_name->_M_string_length);
            pPVar3 = (ParticleUpperBound *)(**(code **)(*(long *)this + 0x88))(this,local_60);
            despot::LookaheadUpperBound::LookaheadUpperBound
                      (this_00,(DSPOMDP *)&this->super_BeliefMDP,&this->super_StateIndexer,pPVar3);
            plVar5 = local_60[0];
            goto LAB_001106ef;
          }
        }
      }
    }
  }
  plVar6 = local_30;
  pcVar1 = (name->_M_dataplus)._M_p;
  local_40[0] = plVar6;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_40,pcVar1,pcVar1 + name->_M_string_length);
  this_00 = (LookaheadUpperBound *)(**(code **)(*(long *)this + 0x88))(this,(string *)local_40);
  plVar5 = local_40[0];
LAB_001106ef:
  if (plVar5 != plVar6) {
    operator_delete(plVar5,*plVar6 + 1);
  }
  return (ScenarioUpperBound *)this_00;
}

Assistant:

ScenarioUpperBound* BaseTag::CreateScenarioUpperBound(string name,
	string particle_bound_name) const {
	if (name == "TRIVIAL" || name == "DEFAULT" || name == "MDP" ||
			name == "SP" || name == "MANHATTAN") {
		return CreateParticleUpperBound(name);
	} else if (name == "LOOKAHEAD") {
		return new LookaheadUpperBound(this, *this,
			CreateParticleUpperBound(particle_bound_name));
	} else {
		if (name != "print")
			cerr << "Unsupported upper bound: " << name << endl;
		cerr << "Supported types: TRIVIAL, MDP, SP, MANHATTAN, LOOKAHEAD (default to SP)" << endl;
		cerr << "With base upper bound: LOOKAHEAD" << endl;
		exit(1);
		return NULL;
	}
}